

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::active_obj::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::disp_data_source_t::distribute_value_for_work_thread
          (disp_data_source_t *this,mbox_t *mbox,agent_t *agent,
          work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
          *wt)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  size_t sVar4;
  undefined1 *puVar5;
  long lVar6;
  prefix_t wt_prefix;
  ostringstream ss;
  suffix_t local_218;
  id local_210;
  work_thread_activity_stats_t local_208;
  prefix_t local_1d8;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  sVar4 = strlen((this->m_base_prefix).m_value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(this->m_base_prefix).m_value,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"/wt-",4);
  uVar1 = *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) = uVar1 & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0x",2);
  std::ostream::_M_insert<long>((long)local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       uVar1 & 0x4a | *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5;
  std::__cxx11::stringbuf::str();
  cVar3 = *(char *)local_208.m_working_stats.m_count;
  if (cVar3 == '\0') {
    puVar5 = local_1d8.m_value;
  }
  else {
    lVar2 = 0;
    do {
      lVar6 = lVar2;
      *(char *)((long)&local_1d8 + lVar6) = cVar3;
      cVar3 = *(char *)(local_208.m_working_stats.m_count + lVar6 + 1);
      if (cVar3 == '\0') break;
      lVar2 = lVar6 + 1;
    } while (lVar6 != 0x2e);
    puVar5 = (undefined1 *)((long)&local_1d8 + lVar6 + 1);
  }
  *puVar5 = 0;
  if ((duration_t *)local_208.m_working_stats.m_count != &local_208.m_working_stats.m_avg_time) {
    operator_delete((void *)local_208.m_working_stats.m_count);
  }
  local_208.m_working_stats.m_count = (uint_fast64_t)stats::suffixes::work_thread_queue_size();
  local_218.m_value =
       (char *)reuse::work_thread::demand_queue_details::
               queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
               ::demands_count(&(wt->super_activity_tracking_impl_t).
                                super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                                .m_queue,
                               &(wt->super_activity_tracking_impl_t).
                                super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                                .m_demands_count);
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long>
            (mbox,&local_1d8,(suffix_t *)&local_208,(unsigned_long *)&local_218);
  local_218 = stats::suffixes::work_thread_activity();
  local_210._M_thread =
       (wt->super_activity_tracking_impl_t).
       super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
       .m_thread_id._M_thread;
  reuse::work_thread::details::activity_tracking_impl_t::take_activity_stats
            (&local_208,&wt->super_activity_tracking_impl_t);
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::work_thread_activity,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            (mbox,&local_1d8,&local_218,&local_210,&local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void
				distribute_value_for_work_thread(
					const mbox_t & mbox,
					const agent_t * agent,
					WORK_THREAD & wt )
					{
						std::ostringstream ss;
						ss << m_base_prefix.c_str() << "/wt-"
								<< so_5::disp::reuse::ios_helpers::pointer{ agent };

						const stats::prefix_t wt_prefix{ ss.str() };

						send_demands_count_stats( mbox, wt_prefix, wt );
						send_thread_activity_stats( mbox, wt_prefix, wt );
					}